

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

uint32_t __thiscall tinyusdz::Attribute::type_id(Attribute *this)

{
  bool bVar1;
  uint32_t uVar2;
  
  if ((this->_type_name)._M_string_length != 0) {
    uVar2 = tinyusdz::value::GetTypeId(&this->_type_name);
    return uVar2;
  }
  bVar1 = is_connection(this);
  if (bVar1) {
    return 0;
  }
  uVar2 = primvar::PrimVar::type_id(&this->_var);
  return uVar2;
}

Assistant:

uint32_t type_id() const {
    if (_type_name.size()) {
      return value::GetTypeId(_type_name);
    }

    if (!is_connection()) {
      // Fallback. May be unreliable(`var` could be empty).
      return _var.type_id();
    }

    return value::TYPE_ID_INVALID;
  }